

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  size_t sVar4;
  PrimRef *pPVar5;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar6;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar7;
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  ulong unaff_RBP;
  BufferView<embree::Vec3fa> *pBVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  float *pfVar25;
  ulong uVar26;
  ulong uVar27;
  ulong unaff_R14;
  ulong uVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar33;
  undefined1 auVar34 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar36;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  undefined1 auVar40 [16];
  size_t local_98;
  size_t local_90;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar10 = _DAT_01f7aa00;
  aVar9 = _DAT_01f7a9f0;
  uVar16 = r->_begin;
  uVar12 = r->_end;
  aVar29 = _DAT_01f7a9f0;
  aVar30 = _DAT_01f7aa00;
  aVar31 = _DAT_01f7aa00;
  aVar32 = _DAT_01f7a9f0;
  if (uVar16 < uVar12) {
    aVar6 = DAT_01f7aa00._0_12_;
    aVar7 = DAT_01f7a9f0._0_12_;
    local_98 = 0;
    local_90 = k;
    do {
      if (uVar16 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar3 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar21 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar17 = *(long *)&(this->super_GridMesh).field_0x68 * uVar16;
        uVar14 = (ulong)*(uint *)(lVar3 + lVar17);
        if (uVar14 < uVar21) {
          uVar1 = *(ushort *)(lVar3 + 10 + lVar17);
          uVar23 = (ulong)uVar1;
          uVar15 = *(uint *)(lVar3 + 4 + lVar17);
          uVar2 = *(ushort *)(lVar3 + 8 + lVar17);
          uVar22 = (ulong)uVar2;
          if (((uint)uVar2 + uVar15 * (uVar1 - 1) + *(uint *)(lVar3 + lVar17)) - 1 < uVar21) {
            if (uVar1 != 0) {
              pBVar19 = (this->super_GridMesh).vertices.items;
              uVar21 = 0;
              do {
                if (uVar2 != 0) {
                  sVar4 = (pBVar19->super_RawBufferView).stride;
                  pfVar25 = (float *)((pBVar19->super_RawBufferView).ptr_ofs + sVar4 * uVar14);
                  unaff_R14 = uVar22;
                  do {
                    auVar34._0_4_ = -(uint)(*pfVar25 < 1.844e+18 && -1.844e+18 < *pfVar25);
                    auVar34._4_4_ = -(uint)(pfVar25[1] < 1.844e+18 && -1.844e+18 < pfVar25[1]);
                    auVar34._8_4_ = -(uint)(pfVar25[2] < 1.844e+18 && -1.844e+18 < pfVar25[2]);
                    auVar34._12_4_ = -(uint)(pfVar25[3] < 1.844e+18 && -1.844e+18 < pfVar25[3]);
                    uVar18 = movmskps((int)unaff_RBP,auVar34);
                    unaff_RBP = (ulong)CONCAT31((int3)((uint)uVar18 >> 8),~(byte)uVar18);
                    if ((~(byte)uVar18 & 7) != 0) goto LAB_009eae77;
                    pfVar25 = (float *)((long)pfVar25 + sVar4);
                    unaff_R14 = unaff_R14 - 1;
                  } while (unaff_R14 != 0);
                }
                uVar21 = uVar21 + 1;
                uVar14 = uVar14 + uVar15;
              } while (uVar21 != uVar23);
              if (uVar1 == 1) goto LAB_009eae77;
            }
            uVar15 = 0;
            uVar12 = uVar22;
            do {
              if ((short)uVar22 == 1) {
                uVar22 = 1;
              }
              else {
                uVar21 = (ulong)uVar15 + 3;
                uVar13 = 0;
                do {
                  uVar23 = (ulong)uVar13;
                  uVar14 = (ulong)(this->super_GridMesh).super_Geometry.numTimeSteps;
                  uVar1 = *(ushort *)(lVar3 + 10 + lVar17);
                  uVar20 = (uint)uVar22;
                  aVar37 = aVar7;
                  aVar33 = aVar6;
                  if (uVar14 != 0) {
                    uVar28 = (ulong)uVar1;
                    if (uVar21 < uVar1) {
                      uVar28 = uVar21;
                    }
                    unaff_RBP = uVar23 + 3;
                    if (uVar22 <= uVar23 + 3) {
                      unaff_RBP = uVar22;
                    }
                    uVar26 = 0;
                    aVar35 = aVar10;
                    aVar38 = aVar9;
                    do {
                      if (uVar15 < uVar1) {
                        pBVar19 = (this->super_GridMesh).vertices.items + uVar26;
                        uVar27 = (ulong)uVar15;
                        do {
                          if (uVar13 < uVar20) {
                            sVar4 = (pBVar19->super_RawBufferView).stride;
                            pauVar11 = (undefined1 (*) [16])
                                       ((pBVar19->super_RawBufferView).ptr_ofs +
                                       (*(uint *)(lVar3 + lVar17) + uVar23 +
                                       *(uint *)(lVar3 + 4 + lVar17) * uVar27) * sVar4);
                            uVar24 = uVar23;
                            do {
                              auVar34 = *pauVar11;
                              auVar8._4_4_ = -(uint)(auVar34._4_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar34._4_4_);
                              auVar8._0_4_ = -(uint)(auVar34._0_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar34._0_4_);
                              auVar8._8_4_ = -(uint)(auVar34._8_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar34._8_4_);
                              auVar8._12_4_ =
                                   -(uint)(auVar34._12_4_ < 1.844e+18 && -1.844e+18 < auVar34._12_4_
                                          );
                              uVar18 = movmskps((int)unaff_R14,auVar8);
                              unaff_R14 = (ulong)CONCAT31((int3)((uint)uVar18 >> 8),~(byte)uVar18);
                              uVar22 = uVar12;
                              if ((~(byte)uVar18 & 7) != 0) goto LAB_009eae30;
                              aVar38.m128 = (__m128)minps(aVar38.m128,auVar34);
                              aVar35.m128 = (__m128)maxps(aVar35.m128,auVar34);
                              uVar24 = uVar24 + 1;
                              pauVar11 = (undefined1 (*) [16])(*pauVar11 + sVar4);
                            } while (uVar24 < unaff_RBP);
                          }
                          uVar27 = uVar27 + 1;
                        } while (uVar27 < uVar28);
                      }
                      aVar33 = aVar35.field_1;
                      aVar37 = aVar38.field_1;
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar14);
                  }
                  aVar39.m128[3] = (float)geomID;
                  aVar39._0_4_ = aVar37.x;
                  aVar39._4_4_ = aVar37.y;
                  aVar39._8_4_ = aVar37.z;
                  aVar36.m128[3] = (float)local_90;
                  aVar36._0_4_ = aVar33.x;
                  aVar36._4_4_ = aVar33.y;
                  aVar36._8_4_ = aVar33.z;
                  aVar32.m128 = (__m128)minps(aVar32.m128,aVar39.m128);
                  aVar31.m128 = (__m128)maxps(aVar31.m128,aVar36.m128);
                  auVar40._0_4_ = aVar37.x + aVar33.x;
                  auVar40._4_4_ = aVar37.y + aVar33.y;
                  auVar40._8_4_ = aVar37.z + aVar33.z;
                  auVar40._12_4_ = (float)geomID + (float)local_90;
                  aVar29.m128 = (__m128)minps(aVar29.m128,auVar40);
                  aVar30.m128 = (__m128)maxps(aVar30.m128,auVar40);
                  local_98 = local_98 + 1;
                  sgrids->items[local_90] =
                       (SubGridBuildData)
                       ((ulong)(uVar13 & 0xfffe | (uint)(uVar20 <= uVar13 + 2) << 0xf) |
                        uVar16 << 0x20 |
                       (ulong)(uVar15 << 0x10 | (uint)((uint)uVar1 <= uVar15 + 2) << 0x1f));
                  pPVar5 = prims->items;
                  pPVar5[local_90].lower.field_0 = aVar39;
                  pPVar5[local_90].upper.field_0 = aVar36;
                  uVar22 = (ulong)*(ushort *)(lVar3 + 8 + lVar17);
                  local_90 = local_90 + 1;
LAB_009eae30:
                  uVar13 = uVar13 + 2;
                  uVar12 = uVar22;
                } while (uVar13 < (int)uVar22 - 1U);
                uVar23 = (ulong)*(ushort *)(lVar3 + 10 + lVar17);
              }
              uVar15 = uVar15 + 2;
            } while (uVar15 < (int)uVar23 - 1U);
            uVar12 = r->_end;
          }
        }
      }
LAB_009eae77:
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar12);
  }
  else {
    local_98 = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar32;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar29;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar30;
  __return_storage_ptr__->end = local_98;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }